

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O3

bool __thiscall
TgBot::Api::restrictChatMember
          (Api *this,int64_t chatId,int32_t userId,uint64_t untilDate,bool canSendMessages,
          bool canSendMediaMessages,bool canSendOtherMessages,bool canAddWebPagePreviews)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  optional<bool> oVar2;
  bool local_e0;
  bool local_df;
  bool local_de;
  bool local_dd;
  int32_t local_dc;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> local_d8;
  uint64_t local_b8;
  int64_t local_b0;
  string local_a8;
  path_type local_88;
  ptree local_58;
  
  local_df = canSendOtherMessages;
  local_e0 = canAddWebPagePreviews;
  local_d8.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_de = canSendMediaMessages;
  local_dd = canSendMessages;
  local_dc = userId;
  local_b8 = untilDate;
  local_b0 = chatId;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::reserve(&local_d8,7);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[8],long&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_d8,
             (char (*) [8])0x25c0ca,&local_b0);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[8],int&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_d8,
             (char (*) [8])"user_id",&local_dc);
  if (untilDate != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[11],unsigned_long&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_d8,
               (char (*) [11])"until_date",&local_b8);
  }
  if (canSendMessages) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[18],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_d8,
               (char (*) [18])"can_send_messages",&local_dd);
  }
  if (canSendMediaMessages) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[24],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_d8,
               (char (*) [24])"can_send_media_messages",&local_de);
  }
  if (canSendOtherMessages) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[24],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_d8,
               (char (*) [24])"can_send_other_messages",&local_df);
  }
  if (canAddWebPagePreviews) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[26],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_d8,
               (char (*) [26])"can_add_web_page_previews",&local_e0);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"restrictChatMember","");
  sendRequest(&local_58,this,&local_a8,&local_d8);
  paVar1 = &local_88.m_value.field_2;
  local_88.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  local_88.m_separator = '.';
  local_88.m_start._M_current = local_88.m_value._M_dataplus._M_p;
  oVar2 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get_optional<bool>(&local_58,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.m_value._M_dataplus._M_p);
  }
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector(&local_d8);
  return (bool)(oVar2.super_type.m_storage & oVar2.super_type.m_initialized & 1);
}

Assistant:

bool Api::restrictChatMember(int64_t chatId, int32_t userId, uint64_t untilDate, bool canSendMessages,
                             bool canSendMediaMessages, bool canSendOtherMessages, bool canAddWebPagePreviews) const {
    vector<HttpReqArg> args;
    args.reserve(7);
    args.emplace_back("chat_id", chatId);
    args.emplace_back("user_id", userId);
    if (untilDate) {
        args.emplace_back("until_date", untilDate);
    }
    if (canSendMessages) {
        args.emplace_back("can_send_messages", canSendMessages);
    }
    if (canSendMediaMessages) {
        args.emplace_back("can_send_media_messages", canSendMediaMessages);
    }
    if (canSendOtherMessages) {
        args.emplace_back("can_send_other_messages", canSendOtherMessages);
    }
    if (canAddWebPagePreviews) {
        args.emplace_back("can_add_web_page_previews", canAddWebPagePreviews);
    }
    return sendRequest("restrictChatMember", args).get<bool>("", false);
}